

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O1

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
          (RepeatedPtrFieldBase *this,int extend_amount)

{
  ArenaImpl *this_00;
  int iVar1;
  Rep *pRVar2;
  uint uVar3;
  Rep *pRVar4;
  uint uVar5;
  ulong n;
  ulong uVar6;
  
  iVar1 = this->current_size_;
  uVar5 = extend_amount + iVar1;
  pRVar4 = this->rep_;
  if (this->total_size_ < (int)uVar5) {
    this_00 = (ArenaImpl *)this->arena_;
    uVar3 = this->total_size_ * 2;
    if ((int)uVar3 <= (int)uVar5) {
      uVar3 = uVar5;
    }
    uVar6 = 4;
    if (4 < (int)uVar3) {
      uVar6 = (ulong)uVar3;
    }
    if (this_00 == (ArenaImpl *)0x0) {
      pRVar2 = (Rep *)operator_new(uVar6 * 8 + 8);
    }
    else {
      n = uVar6 * 8 + 0xf & 0x7fffffff8;
      if (this_00[1].initial_block_ != (Block *)0x0) {
        Arena::OnArenaAllocation((Arena *)this_00,(type_info *)&char::typeinfo,n);
      }
      pRVar2 = (Rep *)ArenaImpl::AllocateAligned(this_00,n);
    }
    this->rep_ = pRVar2;
    this->total_size_ = (int)uVar6;
    if ((pRVar4 == (Rep *)0x0) || ((long)pRVar4->allocated_size < 1)) {
      pRVar2->allocated_size = 0;
    }
    else {
      memcpy(pRVar2->elements,pRVar4->elements,(long)pRVar4->allocated_size << 3);
      this->rep_->allocated_size = pRVar4->allocated_size;
    }
    if (this_00 == (ArenaImpl *)0x0) {
      operator_delete(pRVar4);
    }
    pRVar4 = this->rep_;
    iVar1 = this->current_size_;
  }
  return pRVar4->elements + iVar1;
}

Assistant:

void** RepeatedPtrFieldBase::InternalExtend(int extend_amount) {
  int new_size = current_size_ + extend_amount;
  if (total_size_ >= new_size) {
    // N.B.: rep_ is non-NULL because extend_amount is always > 0, hence
    // total_size must be non-zero since it is lower-bounded by new_size.
    return &rep_->elements[current_size_];
  }
  Rep* old_rep = rep_;
  Arena* arena = GetArenaNoVirtual();
  new_size = std::max(kMinRepeatedFieldAllocationSize,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_CHECK_LE(new_size, (std::numeric_limits<size_t>::max() - kRepHeaderSize) /
                         sizeof(old_rep->elements[0]))
      << "Requested size is too large to fit into size_t.";
  size_t bytes = kRepHeaderSize + sizeof(old_rep->elements[0]) * new_size;
  if (arena == NULL) {
    rep_ = reinterpret_cast<Rep*>(::operator new(bytes));
  } else {
    rep_ = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const int old_total_size = total_size_;
#endif
  total_size_ = new_size;
  if (old_rep && old_rep->allocated_size > 0) {
    memcpy(rep_->elements, old_rep->elements,
           old_rep->allocated_size * sizeof(rep_->elements[0]));
    rep_->allocated_size = old_rep->allocated_size;
  } else {
    rep_->allocated_size = 0;
  }
  if (arena == NULL) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t old_size =
        old_total_size * sizeof(rep_->elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(old_rep), old_size);
#else
    ::operator delete(static_cast<void*>(old_rep));
#endif
  }
  return &rep_->elements[current_size_];
}